

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix.hpp
# Opt level: O2

void __thiscall
qclab::dense::SquareMatrix<double>::SquareMatrix
          (SquareMatrix<double> *this,double m00,double m01,double m02,double m03,double m10,
          double m11,double m12,double m13,double m20,double m21,double m22,double m23,double m30,
          double m31,double m32,double m33)

{
  double *pdVar1;
  
  this->size_ = 4;
  alloc_unique_array<double>((dense *)&this->data_,0x10);
  pdVar1 = (this->data_)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
           super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
           super__Head_base<0UL,_double_*,_false>._M_head_impl;
  *pdVar1 = m00;
  pdVar1[1] = m10;
  pdVar1[2] = m20;
  pdVar1[3] = m30;
  pdVar1[4] = m01;
  pdVar1[5] = m11;
  pdVar1[6] = m21;
  pdVar1[7] = m31;
  pdVar1[8] = m02;
  pdVar1[9] = m12;
  pdVar1[10] = m22;
  pdVar1[0xb] = m32;
  pdVar1[0xc] = m03;
  pdVar1[0xd] = m13;
  pdVar1[0xe] = m23;
  pdVar1[0xf] = m33;
  return;
}

Assistant:

SquareMatrix( const T m00 , const T m01 , const T m02 , const T m03 ,
                      const T m10 , const T m11 , const T m12 , const T m13 ,
                      const T m20 , const T m21 , const T m22 , const T m23 ,
                      const T m30 , const T m31 , const T m32 , const T m33 )
        : size_( 4 )
        , data_( alloc_unique_array< T >( 16 ) )
        {
          data_[ 0] = m00 ; data_[ 1] = m10 ; data_[ 2] = m20 ; data_[ 3] = m30;
          data_[ 4] = m01 ; data_[ 5] = m11 ; data_[ 6] = m21 ; data_[ 7] = m31;
          data_[ 8] = m02 ; data_[ 9] = m12 ; data_[10] = m22 ; data_[11] = m32;
          data_[12] = m03 ; data_[13] = m13 ; data_[14] = m23 ; data_[15] = m33;
        }